

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dangical.cpp
# Opt level: O0

int __thiscall
icu_63::DangiCalendar::clone
          (DangiCalendar *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  DangiCalendar *this_00;
  undefined8 local_30;
  DangiCalendar *this_local;
  
  this_00 = (DangiCalendar *)UMemory::operator_new((UMemory *)0x270,(size_t)__fn);
  local_30 = (DangiCalendar *)0x0;
  if (this_00 != (DangiCalendar *)0x0) {
    DangiCalendar(this_00,this);
    local_30 = this_00;
  }
  return (int)local_30;
}

Assistant:

Calendar*
DangiCalendar::clone() const
{
    return new DangiCalendar(*this);
}